

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

char * on_msg_str(obj *otmp,boolean delayed,boolean deliberate)

{
  char *pcVar1;
  char *local_138;
  char *local_128;
  char local_118 [8];
  char how [256];
  boolean deliberate_local;
  boolean delayed_local;
  obj *otmp_local;
  
  if ((otmp == (obj *)0x0) || (flags.verbose == '\0')) {
    on_msg_str::buf[0] = '\0';
  }
  else {
    local_118[0] = '\0';
    how[0xfe] = deliberate;
    how[0xff] = delayed;
    if (otmp->otyp == 0xef) {
      pcVar1 = body_part(8);
      sprintf(local_118," around your %s",pcVar1);
    }
    if (how[0xfe] == '\0') {
      local_128 = "now wear";
    }
    else {
      local_128 = "wear";
      if (how[0xff] != '\0') {
        local_128 = "finish wearing";
      }
    }
    if ((otmp == uleft) || (otmp == uright)) {
      local_138 = doname(otmp);
    }
    else {
      local_138 = doname_noworn(otmp);
    }
    snprintf(on_msg_str::buf,0x100,"You %s %s%s.",local_128,local_138,local_118);
  }
  return on_msg_str::buf;
}

Assistant:

static const char *on_msg_str(const struct obj *otmp,
			      boolean delayed, boolean deliberate)
{
	static char buf[BUFSZ];

	if (otmp && flags.verbose) {
	    char how[BUFSZ];
	    how[0] = '\0';

	    if (otmp->otyp == TOWEL)
		sprintf(how, " around your %s", body_part(HEAD));
	    snprintf(buf, BUFSZ, "You %s %s%s.",
		     !deliberate ? "now wear" :
		     delayed ? "finish wearing" : "wear",
		     /* hide "(being worn)" but show "(on left hand)" for rings */
		     (otmp == uleft || otmp == uright) ?
			doname(otmp) : doname_noworn(otmp),
		     how);
	} else {
	    buf[0] = '\0';
	}

	return buf;
}